

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall BamTools::BamAlignment::GetTagNames_abi_cxx11_(BamAlignment *this)

{
  char *pcVar1;
  ulong uVar2;
  long in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  char *pTagType;
  char *pTagName;
  uint numBytesParsed;
  uint tagDataLength;
  char *pTagData;
  uint *in_stack_00000090;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result;
  BamAlignment *in_stack_000000a8;
  value_type *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  allocator *paVar3;
  allocator local_59;
  string local_58 [32];
  char *local_38;
  char *local_30;
  uint local_28;
  uint local_24;
  char *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x18964e);
  if (((*(byte *)(in_RSI + 0x130) & 1) == 0) &&
     (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    local_20 = (char *)std::__cxx11::string::data();
    local_24 = std::__cxx11::string::size();
    local_28 = 0;
    while (pcVar1 = local_20, local_28 < local_24) {
      local_30 = local_20;
      local_38 = local_20 + 2;
      local_20 = local_20 + 3;
      local_28 = local_28 + 3;
      paVar3 = &local_59;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_58,pcVar1,2,paVar3);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                  in_stack_ffffffffffffff58);
      std::__cxx11::string::~string(local_58);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
      if (*local_38 == '\0') {
        return in_RDI;
      }
      in_stack_ffffffffffffff67 =
           SkipToNextTag(in_stack_000000a8,result._7_1_,(char **)this,in_stack_00000090);
      if (!(bool)in_stack_ffffffffffffff67) {
        return in_RDI;
      }
      if (*local_20 == '\0') {
        return in_RDI;
      }
    }
  }
  return in_RDI;
}

Assistant:

std::vector<std::string> BamAlignment::GetTagNames() const
{

    std::vector<std::string> result;
    if (SupportData.HasCoreOnly || TagData.empty()) {
        return result;
    }

    char* pTagData = (char*)TagData.data();
    const unsigned int tagDataLength = TagData.size();
    unsigned int numBytesParsed = 0;
    while (numBytesParsed < tagDataLength) {

        // get current tag name & type
        const char* pTagName = pTagData;
        const char* pTagType = pTagData + 2;
        pTagData += 3;
        numBytesParsed += 3;

        // store tag name
        result.push_back(std::string(pTagName, 2));

        // find the next tag
        if (*pTagType == '\0') {
            break;
        }
        if (!SkipToNextTag(*pTagType, pTagData, numBytesParsed)) {
            break;
        }
        if (*pTagData == '\0') {
            break;
        }
    }

    return result;
}